

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O2

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::generate(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *base)

{
  DataArray<int> *this_00;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_02;
  uint *puVar1;
  double dVar2;
  undefined1 uVar3;
  byte bVar4;
  Representation RVar5;
  uint uVar6;
  undefined4 uVar7;
  int iVar8;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar10;
  undefined8 uVar11;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pAVar12;
  type_conflict5 tVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  DataKey DVar21;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_03;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  uint *puVar28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar29;
  int *piVar30;
  DataArray<int> *pDVar31;
  DataArray<int> *pDVar32;
  multiprecision *pmVar33;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pAVar34;
  ulong uVar35;
  byte bVar36;
  Real val;
  ulong local_460;
  DataArray<soplex::SPxId> pref;
  SPxId tmpId;
  DataArray<int> col;
  Desc desc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  feastol;
  DataArray<int> row;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  multiprecision local_b0 [112];
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar36 = 0;
  tmpId.super_DataKey.info = 0;
  tmpId.super_DataKey.idx = -1;
  this_00 = &this->forbidden;
  DataArray<int>::reSize(this_00,(base->thecovectors->set).thenum);
  this_01 = &this->rowWeight;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reSize(this_01,(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
  this_02 = &this->colWeight;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reSize(this_02,(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
  DataArray<bool>::reSize
            (&this->rowRight,
             (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  DataArray<bool>::reSize
            (&this->colUp,
             (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  pAVar34 = this_02;
  pAVar12 = this_01;
  if (base->theRep == COLUMN) {
    pAVar34 = this_01;
    pAVar12 = this_02;
  }
  this->weight = pAVar12;
  this->coWeight = pAVar34;
  (*(this->
    super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxStarter[8])(this,base);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Desc::Desc(&desc,base);
  DataArray<soplex::SPxId>::DataArray
            (&pref,(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum +
                   (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum,0,1.2);
  DataArray<int>::DataArray
            (&row,(base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum,0,1.2);
  DataArray<int>::DataArray
            (&col,(base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum,0,1.2);
  for (lVar18 = 0;
      lVar18 < (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum; lVar18 = lVar18 + 1) {
    row.data[lVar18] = (int)lVar18;
  }
  feastol.m_backend.data._M_elems._0_8_ =
       (this_01->data).
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>
            (row.data,row.thesize,
             (Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&feastol,0,true);
  for (lVar18 = 0;
      lVar18 < (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum; lVar18 = lVar18 + 1) {
    col.data[lVar18] = (int)lVar18;
  }
  feastol.m_backend.data._M_elems._0_8_ =
       (this_02->data).
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar27 = 0;
  SPxQuicksort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>>
            (col.data,col.thesize,
             (Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&feastol,0,true);
  uVar25 = 0;
  uVar20 = 0;
LAB_00431f64:
  do {
    uVar35 = (ulong)(int)uVar27;
    iVar23 = (int)uVar25;
    iVar14 = (int)uVar20;
    uVar19 = (ulong)iVar14;
    uVar24 = uVar20 & 0xffffffff;
    lVar18 = 0;
    uVar20 = uVar19;
    do {
      uVar20 = uVar20 + 1;
      if (pref.thesize <= iVar14 + (int)lVar18) {
        DataArray<int>::~DataArray(&col);
        DataArray<int>::~DataArray(&row);
        iVar23 = pref.thesize;
        pSVar9 = base->thecovectors;
        piVar30 = (this->forbidden).data;
        for (lVar18 = 0; local_460 = (ulong)(pSVar9->set).thenum, lVar18 < (long)local_460;
            lVar18 = lVar18 + 1) {
          piVar30[lVar18] = 0;
        }
        RVar5 = base->theRep;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<200U,_int,_void> *)&row,0,(type *)0x0);
        iVar14 = (uint)(RVar5 == COLUMN) * 2 + -1;
        uVar26 = iVar23 - 1U;
        uVar15 = iVar23 - 1U;
        if (RVar5 == COLUMN) {
          uVar26 = 0;
          uVar15 = 0;
        }
        do {
          uVar15 = iVar14 + uVar15;
          if (((int)uVar26 < 0) || (pref.thesize <= (int)uVar26)) goto LAB_00432861;
          tmpId.super_DataKey = pref.data[uVar26].super_DataKey;
          this_03 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::vector(base,&tmpId);
          if (this_03->memused == 1) {
            uVar17 = this_03->m_elem->idx;
            iVar23 = (this->forbidden).data[(int)uVar17];
            if (iVar23 < 2) {
              local_460 = (ulong)((int)local_460 + (uint)(iVar23 == 1));
              goto LAB_0043244b;
            }
LAB_0043248f:
            if (base->theRep == COLUMN) {
              setPrimalStatus(this,&desc,base,pref.data + uVar26);
            }
            else {
              setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&desc,base,pref.data + uVar26);
            }
          }
          else {
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&col,this_03);
            pDVar31 = &col;
            pDVar32 = &row;
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              pDVar32->thesize = pDVar31->thesize;
              pDVar31 = (DataArray<int> *)((long)pDVar31 + (ulong)bVar36 * -8 + 4);
              pDVar32 = (DataArray<int> *)((long)pDVar32 + (ulong)bVar36 * -8 + 4);
            }
            iVar23 = (base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
            uVar25 = (ulong)(uint)this_03->memused;
            lVar18 = uVar25 * 0x84 + -4;
            uVar17 = 0xffffffff;
            while( true ) {
              if ((int)uVar25 < 1) break;
              pNVar10 = this_03->m_elem;
              puVar1 = (uint *)((long)(pNVar10->val).m_backend.data._M_elems + lVar18);
              puVar28 = puVar1 + -0x20;
              pnVar29 = &result;
              for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
                (pnVar29->m_backend).data._M_elems[0] = *puVar28;
                puVar28 = puVar28 + (ulong)bVar36 * -2 + 1;
                pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar29 + ((ulong)bVar36 * -2 + 1) * 4);
              }
              uVar6 = *puVar1;
              if ((this->forbidden).data[(int)uVar6] == 0) {
                uVar7 = *(undefined4 *)
                         ((long)(pNVar10->val).m_backend.data._M_elems + lVar18 + -0x10);
                uVar3 = *(undefined1 *)
                         ((long)(pNVar10->val).m_backend.data._M_elems + lVar18 + -0xc);
                uVar11 = *(undefined8 *)((long)(pNVar10->val).m_backend.data._M_elems + lVar18 + -8)
                ;
                iVar8 = (base->thecovectors->set).theitem
                        [(base->thecovectors->set).thekey[(int)uVar6].idx].data.
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused;
                pnVar29 = &result;
                pmVar33 = local_b0;
                for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
                  *(uint *)pmVar33 = (pnVar29->m_backend).data._M_elems[0];
                  pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar29 + ((ulong)bVar36 * -2 + 1) * 4);
                  pmVar33 = pmVar33 + (ulong)bVar36 * -8 + 4;
                }
                local_40 = uVar7;
                local_3c = uVar3;
                local_38 = uVar11;
                boost::multiprecision::
                abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          ((type *)&col,local_b0,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_b0);
                iVar16 = (*(this->
                           super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxStarter[6])();
                dVar2 = *(double *)(*(long *)CONCAT44(extraout_var,iVar16) + 0x40);
                uVar20 = -(ulong)(dVar2 == 1.0);
                local_130.m_backend.data._M_elems._0_8_ =
                     ~uVar20 & (ulong)(dVar2 * 0.001) | uVar20 & 0x3f50624dd2f1a9fc;
                feastol.m_backend.fpclass = cpp_dec_float_finite;
                feastol.m_backend.prec_elem = 0x1c;
                feastol.m_backend.data._M_elems[0] = 0;
                feastol.m_backend.data._M_elems[1] = 0;
                feastol.m_backend.data._M_elems[2] = 0;
                feastol.m_backend.data._M_elems[3] = 0;
                feastol.m_backend.data._M_elems[4] = 0;
                feastol.m_backend.data._M_elems[5] = 0;
                feastol.m_backend.data._M_elems[6] = 0;
                feastol.m_backend.data._M_elems[7] = 0;
                feastol.m_backend.data._M_elems[8] = 0;
                feastol.m_backend.data._M_elems[9] = 0;
                feastol.m_backend.data._M_elems[10] = 0;
                feastol.m_backend.data._M_elems[0xb] = 0;
                feastol.m_backend.data._M_elems[0xc] = 0;
                feastol.m_backend.data._M_elems[0xd] = 0;
                feastol.m_backend.data._M_elems[0xe] = 0;
                feastol.m_backend.data._M_elems[0xf] = 0;
                feastol.m_backend.data._M_elems[0x10] = 0;
                feastol.m_backend.data._M_elems[0x11] = 0;
                feastol.m_backend.data._M_elems[0x12] = 0;
                feastol.m_backend.data._M_elems[0x13] = 0;
                feastol.m_backend.data._M_elems[0x14] = 0;
                feastol.m_backend.data._M_elems[0x15] = 0;
                feastol.m_backend.data._M_elems[0x16] = 0;
                feastol.m_backend.data._M_elems[0x17] = 0;
                feastol.m_backend.data._M_elems[0x18] = 0;
                feastol.m_backend.data._M_elems[0x19] = 0;
                feastol.m_backend.data._M_elems._104_5_ = 0;
                feastol.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                feastol.m_backend.exp = 0;
                feastol.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                          (&feastol.m_backend,(cpp_dec_float<200U,_int,_void> *)&row,
                           (double *)&local_130);
                tVar13 = boost::multiprecision::operator>
                                   ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&col,&feastol);
                if ((tVar13) && (iVar8 < iVar23)) {
                  uVar17 = uVar6;
                  iVar23 = iVar8;
                }
              }
              uVar25 = (ulong)((int)uVar25 - 1);
              lVar18 = lVar18 + -0x84;
            }
LAB_0043244b:
            if ((int)uVar17 < 0) goto LAB_0043248f;
            (this->forbidden).data[uVar17] = 2;
            if (base->theRep == COLUMN) {
              setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&desc,base,pref.data + uVar26);
            }
            else {
              setPrimalStatus(this,&desc,base,pref.data + uVar26);
            }
            uVar25 = (ulong)(uint)this_03->memused;
            lVar18 = uVar25 * 0x84;
            while( true ) {
              if ((int)uVar25 < 1) break;
              pNVar10 = this_03->m_elem;
              piVar30 = (int *)((long)pNVar10[-1].val.m_backend.data._M_elems + lVar18);
              pDVar31 = &col;
              for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
                pDVar31->thesize = *piVar30;
                piVar30 = piVar30 + (ulong)bVar36 * -2 + 1;
                pDVar31 = (DataArray<int> *)((long)pDVar31 + (ulong)bVar36 * -8 + 4);
              }
              iVar23 = *(int *)((long)(pNVar10->val).m_backend.data._M_elems + lVar18 + -0x14);
              bVar4 = *(byte *)((long)(pNVar10->val).m_backend.data._M_elems + lVar18 + -0x10);
              uVar11 = *(undefined8 *)((long)(pNVar10->val).m_backend.data._M_elems + lVar18 + -0xc)
              ;
              iVar8 = *(int *)((long)(this_03->m_elem->val).m_backend.data._M_elems + lVar18 + -4);
              iVar16 = (*(this->
                         super_SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxStarter[6])(this);
              val = Tolerances::floatingPointFeastol
                              (*(Tolerances **)CONCAT44(extraout_var_00,iVar16));
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        (&feastol.m_backend,val,(type *)0x0);
              if ((this->forbidden).data[iVar8] == 0) {
                result.m_backend.fpclass = cpp_dec_float_finite;
                result.m_backend.prec_elem = 0x1c;
                result.m_backend.data._M_elems[0] = 0;
                result.m_backend.data._M_elems[1] = 0;
                result.m_backend.data._M_elems[2] = 0;
                result.m_backend.data._M_elems[3] = 0;
                result.m_backend.data._M_elems[4] = 0;
                result.m_backend.data._M_elems[5] = 0;
                result.m_backend.data._M_elems[6] = 0;
                result.m_backend.data._M_elems[7] = 0;
                result.m_backend.data._M_elems[8] = 0;
                result.m_backend.data._M_elems[9] = 0;
                result.m_backend.data._M_elems[10] = 0;
                result.m_backend.data._M_elems[0xb] = 0;
                result.m_backend.data._M_elems[0xc] = 0;
                result.m_backend.data._M_elems[0xd] = 0;
                result.m_backend.data._M_elems[0xe] = 0;
                result.m_backend.data._M_elems[0xf] = 0;
                result.m_backend.data._M_elems[0x10] = 0;
                result.m_backend.data._M_elems[0x11] = 0;
                result.m_backend.data._M_elems[0x12] = 0;
                result.m_backend.data._M_elems[0x13] = 0;
                result.m_backend.data._M_elems[0x14] = 0;
                result.m_backend.data._M_elems[0x15] = 0;
                result.m_backend.data._M_elems[0x16] = 0;
                result.m_backend.data._M_elems[0x17] = 0;
                result.m_backend.data._M_elems[0x18] = 0;
                result.m_backend.data._M_elems[0x19] = 0;
                result.m_backend.data._M_elems._104_5_ = 0;
                result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result.m_backend.exp = 0;
                result.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (&result.m_backend,&feastol.m_backend,
                           (cpp_dec_float<200U,_int,_void> *)&row);
                tVar13 = boost::multiprecision::operator>
                                   ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&col,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                             *)&result.m_backend);
                if (!tVar13) {
                  pDVar31 = &col;
                  pnVar29 = &local_130;
                  for (lVar22 = 0x1c; lVar22 != 0; lVar22 = lVar22 + -1) {
                    (pnVar29->m_backend).data._M_elems[0] = pDVar31->thesize;
                    pDVar31 = (DataArray<int> *)((long)pDVar31 + (ulong)bVar36 * -8 + 4);
                    pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar29 + (ulong)bVar36 * -8 + 4);
                  }
                  local_130.m_backend.neg = (bool)bVar4;
                  if ((fpclass_type)uVar11 != cpp_dec_float_finite ||
                      local_130.m_backend.data._M_elems[0] != 0) {
                    local_130.m_backend.neg = (bool)(bVar4 ^ 1);
                  }
                  result_1.m_backend.fpclass = cpp_dec_float_finite;
                  result_1.m_backend.prec_elem = 0x1c;
                  result_1.m_backend.data._M_elems[0] = 0;
                  result_1.m_backend.data._M_elems[1] = 0;
                  result_1.m_backend.data._M_elems[2] = 0;
                  result_1.m_backend.data._M_elems[3] = 0;
                  result_1.m_backend.data._M_elems[4] = 0;
                  result_1.m_backend.data._M_elems[5] = 0;
                  result_1.m_backend.data._M_elems[6] = 0;
                  result_1.m_backend.data._M_elems[7] = 0;
                  result_1.m_backend.data._M_elems[8] = 0;
                  result_1.m_backend.data._M_elems[9] = 0;
                  result_1.m_backend.data._M_elems[10] = 0;
                  result_1.m_backend.data._M_elems[0xb] = 0;
                  result_1.m_backend.data._M_elems[0xc] = 0;
                  result_1.m_backend.data._M_elems[0xd] = 0;
                  result_1.m_backend.data._M_elems[0xe] = 0;
                  result_1.m_backend.data._M_elems[0xf] = 0;
                  result_1.m_backend.data._M_elems[0x10] = 0;
                  result_1.m_backend.data._M_elems[0x11] = 0;
                  result_1.m_backend.data._M_elems[0x12] = 0;
                  result_1.m_backend.data._M_elems[0x13] = 0;
                  result_1.m_backend.data._M_elems[0x14] = 0;
                  result_1.m_backend.data._M_elems[0x15] = 0;
                  result_1.m_backend.data._M_elems[0x16] = 0;
                  result_1.m_backend.data._M_elems[0x17] = 0;
                  result_1.m_backend.data._M_elems[0x18] = 0;
                  result_1.m_backend.data._M_elems[0x19] = 0;
                  result_1.m_backend.data._M_elems._104_5_ = 0;
                  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                  result_1.m_backend.exp = 0;
                  result_1.m_backend.neg = false;
                  local_130.m_backend.exp = iVar23;
                  local_130.m_backend._120_8_ = uVar11;
                  boost::multiprecision::default_ops::
                  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            (&result_1.m_backend,&feastol.m_backend,
                             (cpp_dec_float<200U,_int,_void> *)&row);
                  tVar13 = boost::multiprecision::operator>
                                     (&local_130,
                                      (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)&result_1.m_backend);
                  if (!tVar13) goto LAB_00432702;
                }
                (this->forbidden).data[iVar8] = 1;
                local_460 = (ulong)((int)local_460 - 1);
              }
LAB_00432702:
              uVar25 = (ulong)((int)uVar25 - 1);
              lVar18 = lVar18 + -0x84;
            }
            uVar17 = (int)local_460 - 1;
            local_460 = (ulong)uVar17;
            if (uVar17 == 0) {
              if (base->theRep == COLUMN) {
                for (; (-1 < (int)uVar15 && ((int)uVar15 < pref.thesize)); uVar15 = uVar15 + iVar14)
                {
                  setPrimalStatus(this,&desc,base,pref.data + uVar15);
                }
                uVar26 = this_00->thesize;
                while (0 < (int)uVar26) {
                  uVar26 = uVar26 - 1;
                  if ((this->forbidden).data[uVar26] < 2) {
                    col._0_8_ = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::coId(base,uVar26);
                    setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&desc,base,(SPxId *)&col);
                  }
                }
              }
              else {
                for (; (-1 < (int)uVar15 && ((int)uVar15 < pref.thesize)); uVar15 = uVar15 + iVar14)
                {
                  setDualStatus<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&desc,base,pref.data + uVar15);
                }
                uVar26 = this_00->thesize;
                while (0 < (int)uVar26) {
                  uVar26 = uVar26 - 1;
                  if ((this->forbidden).data[uVar26] < 2) {
                    col._0_8_ = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::coId(base,uVar26);
                    setPrimalStatus(this,&desc,base,(SPxId *)&col);
                  }
                }
              }
LAB_00432861:
              (*(base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x58])(base,&desc);
              DataArray<soplex::SPxId>::~DataArray(&pref);
              SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::Desc::~Desc(&desc);
              return;
            }
          }
          uVar26 = uVar26 + iVar14;
        } while( true );
      }
      tVar13 = boost::multiprecision::operator<
                         ((this_01->data).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + row.data[uVar35],
                          (this_02->data).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + col.data[iVar23 + lVar18]);
      if (tVar13) {
        DVar21 = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::rId(&base->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ,row.data[uVar35]);
        pref.data[iVar14 + lVar18].super_DataKey = DVar21;
        pref.data[iVar14 + lVar18].super_DataKey.info = -1;
        uVar26 = (int)uVar27 + 1;
        uVar27 = (ulong)uVar26;
        if ((int)uVar26 <
            (base->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
          uVar25 = (uVar25 & 0xffffffff) + lVar18;
          uVar20 = uVar24 + lVar18 + 1;
        }
        else {
          uVar25 = iVar23 + lVar18;
          for (; (long)uVar20 < (long)pref.thesize; uVar20 = uVar20 + 1) {
            DVar21 = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::cId(&base->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ,col.data[uVar25]);
            uVar25 = uVar25 + 1;
            pref.data[uVar20].super_DataKey = DVar21;
            pref.data[uVar20].super_DataKey.info = 1;
          }
        }
        goto LAB_00431f64;
      }
      DVar21 = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::cId(&base->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ,col.data[iVar23 + lVar18]);
      pref.data[uVar19 + lVar18].super_DataKey = DVar21;
      pref.data[uVar19 + lVar18].super_DataKey.info = 1;
      lVar18 = lVar18 + 1;
    } while ((int)lVar18 + iVar23 <
             (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
    uVar25 = (uVar25 & 0xffffffff) + lVar18;
    for (; (long)uVar20 < (long)pref.thesize; uVar20 = uVar20 + 1) {
      DVar21 = (DataKey)SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::rId(&base->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ,row.data[uVar35]);
      uVar35 = uVar35 + 1;
      pref.data[uVar20].super_DataKey = DVar21;
      pref.data[uVar20].super_DataKey.info = -1;
    }
    uVar27 = uVar35 & 0xffffffff;
  } while( true );
}

Assistant:

void SPxWeightST<R>::generate(SPxSolverBase<R>& base)
{
   SPxId tmpId;

   forbidden.reSize(base.dim());
   rowWeight.reSize(base.nRows());
   colWeight.reSize(base.nCols());
   rowRight.reSize(base.nRows());
   colUp.reSize(base.nCols());

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      weight   = &colWeight;
      coWeight = &rowWeight;
   }
   else
   {
      weight   = &rowWeight;
      coWeight = &colWeight;
   }

   assert(weight->size()   == base.coDim());
   assert(coWeight->size() == base.dim());

   setupWeights(base);

   typename SPxBasisBase<R>::Desc desc(base);
   //   desc.reSize(base.nRows(), base.nCols());

   DataArray < SPxId > pref(base.nRows() + base.nCols());
   initPrefs(pref, base, rowWeight, colWeight);

   int i;
   int stepi;
   int j;
   int sel;

   for(i = 0; i < base.dim(); ++i)
      forbidden[i] = 0;

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      // in COLUMN rep we scan from beginning to end
      i      = 0;
      stepi = 1;
   }
   else
   {
      // in ROW rep we scan from end to beginning
      i      = pref.size() - 1;
      stepi = -1;
   }

   int  dim = base.dim();
   R maxEntry = 0;

   for(; i >= 0 && i < pref.size(); i += stepi)
   {
      tmpId              = pref[i];
      const SVectorBase<R>& vec = base.vector(tmpId);
      sel                = -1;

      // column or row singleton ?
      if(vec.size() == 1)
      {
         int idx = vec.index(0);

         if(forbidden[idx] < 2)
         {
            sel  = idx;
            dim += (forbidden[idx] > 0) ? 1 : 0;
         }
      }
      else
      {
         maxEntry = vec.maxAbs();

         // initialize the nonzero counter
         int minRowEntries = base.nRows();

         // find a stable index with a sparse row/column
         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            int  nRowEntries = base.coVector(k).size();

            if(!forbidden[k]
                  && (spxAbs(x) > this->tolerances()->scaleAccordingToEpsilon(SOPLEX_STABLE) * maxEntry)
                  && (nRowEntries < minRowEntries))
            {
               minRowEntries = nRowEntries;
               sel  = k;
            }
         }
      }

      // we found a valid index
      if(sel >= 0)
      {
         SPX_DEBUG(

            if(pref[i].type() == SPxId::ROW_ID)
            std::cout << "DWEIST01 r" << base.number(pref[i]);
            else
               std::cout << "DWEIST02 c" << base.number(pref[i]);
            )

               forbidden[sel] = 2;

         // put current column/row into basis
         if(base.rep() == SPxSolverBase<R>::COLUMN)
            setDualStatus(desc, base, pref[i]);
         else
            setPrimalStatus(desc, base, pref[i]);

         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            R feastol = this->tolerances()->floatingPointFeastol();

            if(!forbidden[k] && (x > feastol * maxEntry || -x > feastol * maxEntry))
            {
               forbidden[k] = 1;
               --dim;
            }
         }

         if(--dim == 0)
         {
            //@ for(++i; i < pref.size(); ++i)
            if(base.rep() == SPxSolverBase<R>::COLUMN)
            {
               // set all remaining indeces to nonbasic status
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setPrimalStatus(desc, base, pref[i]);

               // fill up the basis wherever linear independence is assured
               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setDualStatus(desc, base, base.coId(i));
               }
            }
            else
            {
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setDualStatus(desc, base, pref[i]);

               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setPrimalStatus(desc, base, base.coId(i));
               }
            }

            break;
         }
      }
      // sel == -1
      else if(base.rep() == SPxSolverBase<R>::COLUMN)
         setPrimalStatus(desc, base, pref[i]);
      else
         setDualStatus(desc, base, pref[i]);

#ifndef NDEBUG
      {
         int n, m;

         for(n = 0, m = forbidden.size(); n < forbidden.size(); ++n)
            m -= (forbidden[n] != 0) ? 1 : 0;

         assert(m == dim);
      }
#endif  // NDEBUG
   }

   assert(dim == 0);

   base.loadBasis(desc);
#ifdef  TEST
   base.init();

   int changed = 0;
   const VectorBase<R>& pvec = base.pVec();

   for(i = pvec.dim() - 1; i >= 0; --i)
   {
      if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_UPPER
            && base.lower(i) > R(-infinity) && pvec[i] > base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
      else if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
              && base.upper(i) < R(infinity) && pvec[i] < base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      }
   }

   if(changed)
   {
      std::cout << "changed basis\n";
      base.loadBasis(desc);
   }
   else
      std::cout << "nothing changed\n";

#endif  // TEST
}